

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O2

void anon_unknown.dwarf_232db::decrease_runners(void)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  Twine *pTVar4;
  Twine *pTVar5;
  ulong uVar6;
  vector<llvm::Type*,std::allocator<llvm::Type*>> *this;
  vector<llvm::Type*,std::allocator<llvm::Type*>> *in_RSI;
  uint uVar7;
  long lVar8;
  Child aCStack_60 [2];
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)((anonymous_namespace)::Shmem + 8));
  lVar8 = (anonymous_namespace)::Shmem;
  if (iVar2 == 0) {
    if ((int)(anonymous_namespace)::Cores._128_4_ < *(int *)((anonymous_namespace)::Shmem + 0x148c))
    goto LAB_00265b98;
    *(int *)((anonymous_namespace)::Shmem + 0x148c) =
         *(int *)((anonymous_namespace)::Shmem + 0x148c) + -1;
    uVar3 = 99;
    do {
      if ((int)uVar3 < 0) goto LAB_00265b7d;
      uVar6 = (ulong)uVar3;
      iVar2 = *(int *)(lVar8 + 0x12f8 + uVar6 * 4);
      uVar3 = uVar3 - 1;
    } while (iVar2 == 0);
    *(int *)(lVar8 + 0x12f8 + uVar6 * 4) = iVar2 + -1;
    iVar2 = pthread_cond_signal((pthread_cond_t *)(lVar8 + uVar6 * 0x30 + 0x38));
    lVar8 = (anonymous_namespace)::Shmem;
    if (iVar2 != 0) goto LAB_00265bb0;
LAB_00265b7d:
    iVar2 = pthread_mutex_unlock((pthread_mutex_t *)(lVar8 + 8));
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    die("lock failed");
LAB_00265b98:
    die("Shmem->Running <= Cores failed at line __LINE__");
  }
  die("unlock failed");
LAB_00265bb0:
  uVar7 = 0x7778a1;
  die("pthread_cond_signal failed");
  uVar3 = uVar7;
  if ((int)uVar7 < (int)(anonymous_namespace)::Promote._128_4_) {
    uVar3 = (anonymous_namespace)::Promote._128_4_;
  }
  if ((anonymous_namespace)::Promote._128_4_ == -1) {
    uVar3 = uVar7;
  }
  aCStack_60[0]._0_8_ = llvm::Type::getIntNTy((LLVMContext *)&(anonymous_namespace)::C,uVar7);
  std::vector<llvm::Type*,std::allocator<llvm::Type*>>::emplace_back<llvm::Type*>
            (in_RSI,(Type **)&aCStack_60[0].twine);
  pTVar4 = (Twine *)llvm::Type::getIntNTy((LLVMContext *)&(anonymous_namespace)::C,uVar3);
  aCStack_60[0]._0_8_ = pTVar4;
  std::vector<llvm::Type*,std::allocator<llvm::Type*>>::emplace_back<llvm::Type*>
            (this,(Type **)&aCStack_60[0].twine);
  if ((anonymous_namespace)::ArgsFromMem[0x80] == '\x01') {
    pTVar5 = (Twine *)llvm::GlobalVariable::operator_new(0x58);
    uVar1 = (anonymous_namespace)::M;
    llvm::Twine::Twine((Twine *)&aCStack_60[0].ptrAndLength,"");
    llvm::GlobalVariable::GlobalVariable
              ((GlobalVariable *)pTVar5,uVar1,pTVar4,0,0,0,aCStack_60,0,0,0,0);
    aCStack_60[0]._0_8_ = pTVar5;
    std::vector<llvm::Value*,std::allocator<llvm::Value*>>::emplace_back<llvm::Value*>
              ((vector<llvm::Value*,std::allocator<llvm::Value*>> *)(anonymous_namespace)::globs,
               (Value **)&aCStack_60[0].twine);
  }
  return;
}

Assistant:

void decrease_runners(void) {
  if (pthread_mutex_lock(&Shmem->Lock) != 0)
    die("lock failed");

  assert(Shmem->Running <= Cores);

  Shmem->Running--;
  // FIXME could cache the max depth, perhaps don't care
  for (int i = MAX_DEPTH - 1; i >= 0; --i) {
    if (Shmem->Waiting[i] != 0) {
      Shmem->Waiting[i]--;
      if (pthread_cond_signal(&Shmem->Cond[i]) != 0)
        die("pthread_cond_signal failed");
      break;
    }
  }

  if (pthread_mutex_unlock(&Shmem->Lock) != 0)
    die("unlock failed");
}